

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcConstructionResource.field_0x68 = 0x84c970;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x50 = 0x84ca60;
  *(undefined8 *)
   &this[-1].super_IfcConstructionResource.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x10 = 0x84c998;
  *(undefined8 *)
   &this[-1].super_IfcConstructionResource.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x20 = 0x84c9c0;
  *(undefined8 *)&this[-1].super_IfcConstructionResource.ResourceGroup.have = 0x84c9e8;
  this[-1].super_IfcConstructionResource.ResourceConsumption.ptr._M_string_length = 0x84ca10;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x84ca38;
  puVar1 = *(undefined1 **)&(this->super_IfcConstructionResource).field_0x28;
  puVar2 = &(this->super_IfcConstructionResource).field_0x38;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_IfcConstructionResource).field_0x18;
  puVar2 = &this[-1].super_IfcConstructionResource.field_0x68;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  IfcConstructionResource::~IfcConstructionResource
            ((IfcConstructionResource *)puVar2,&PTR_construction_vtable_24__0084ca78);
  operator_delete(puVar2,0x1e0);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}